

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O3

void __thiscall cmLBDepend::GenerateDependInformation(cmLBDepend *this,cmDependInformation *info)

{
  string *filename;
  pointer pbVar1;
  cmMakefile *this_00;
  size_t sVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  cmSourceFile *pcVar7;
  string *psVar8;
  undefined8 unaff_RBP;
  const_iterator __begin3;
  pointer pbVar9;
  string incpath;
  string local_88;
  uint local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  cmSourceFile *local_40;
  pointer local_38;
  
  if (info->DependDone != false) {
    return;
  }
  info->DependDone = true;
  if ((info->FullPath)._M_string_length == 0) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Attempt to find dependencies for file without path!","");
    cmSystemTools::Error(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return;
    }
  }
  else {
    filename = &info->FullPath;
    bVar4 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar4) {
      DependWalk(this,info);
      local_64 = (uint)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    }
    else {
      local_64 = 0;
    }
    pcVar7 = info->SourceFile;
    if (pcVar7 != (cmSourceFile *)0x0) {
      pbVar9 = (pcVar7->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (pcVar7->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar9 != pbVar1) {
        do {
          AddDependency(this,info,(pbVar9->_M_dataplus)._M_p);
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar1);
        return;
      }
    }
    if ((char)local_64 == '\0') {
      this_00 = this->Makefile;
      cmsys::SystemTools::GetFilenameWithoutExtension(&local_88,filename);
      pcVar7 = cmMakefile::GetSource(this_00,&local_88,Ambiguous);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (pcVar7 != (cmSourceFile *)0x0) {
        psVar8 = cmSourceFile::GetFullPath(pcVar7,(string *)0x0);
        sVar2 = psVar8->_M_string_length;
        if (sVar2 == (info->FullPath)._M_string_length) {
          if (sVar2 == 0) {
            return;
          }
          iVar5 = bcmp((psVar8->_M_dataplus)._M_p,(filename->_M_dataplus)._M_p,sVar2);
          if (iVar5 == 0) {
            return;
          }
        }
        pbVar9 = (this->IncludeDirectories).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_38 = (this->IncludeDirectories).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar9 != local_38) {
          local_40 = pcVar7;
          do {
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            pcVar3 = (pbVar9->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,pcVar3,pcVar3 + pbVar9->_M_string_length);
            if ((local_88._M_string_length != 0) &&
               (local_88._M_dataplus._M_p[local_88._M_string_length - 1] != '/')) {
              local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_60,local_88._M_dataplus._M_p,
                         local_88._M_dataplus._M_p + local_88._M_string_length);
              std::__cxx11::string::append((char *)&local_60);
              std::__cxx11::string::operator=((string *)&local_88,(string *)&local_60);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1
                               );
              }
            }
            std::operator+(&local_60,&local_88,filename);
            std::__cxx11::string::operator=((string *)&local_88,(string *)&local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            }
            psVar8 = cmSourceFile::GetFullPath(local_40,(string *)0x0);
            sVar2 = psVar8->_M_string_length;
            if (sVar2 == local_88._M_string_length) {
              if (sVar2 != 0) {
                uVar6 = bcmp((psVar8->_M_dataplus)._M_p,local_88._M_dataplus._M_p,sVar2);
                psVar8 = (string *)(ulong)uVar6;
                if (uVar6 != 0) goto LAB_00232683;
              }
              local_64 = (uint)CONCAT71((int7)((ulong)psVar8 >> 8),1);
              std::__cxx11::string::_M_assign((string *)filename);
            }
LAB_00232683:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            pbVar9 = pbVar9 + 1;
          } while (pbVar9 != local_38);
        }
      }
    }
    if ((local_64 & 1) != 0) {
      return;
    }
    bVar4 = cmsys::RegularExpression::find
                      (&this->ComplainFileRegularExpression,(info->IncludeName)._M_dataplus._M_p,
                       &(this->ComplainFileRegularExpression).regmatch);
    if (!bVar4) {
      (info->FullPath)._M_string_length = 0;
      *(info->FullPath)._M_dataplus._M_p = '\0';
      return;
    }
    std::operator+(&local_88,"error cannot find dependencies for ",filename);
    cmSystemTools::Error(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return;
    }
  }
  operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if (info->DependDone) {
      return;
    }
    // Make sure we don't visit the same file more than once.
    info->DependDone = true;

    const std::string& path = info->FullPath;
    if (path.empty()) {
      cmSystemTools::Error(
        "Attempt to find dependencies for file without path!");
      return;
    }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if (cmSystemTools::FileExists(path, true)) {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
    }

    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if (info->SourceFile != nullptr) {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if (!cFile.GetDepends().empty()) {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for (std::string const& file : cFile.GetDepends()) {
          this->AddDependency(info, file.c_str());
        }

        // Found dependency information.  We are done.
        found = true;
      }
    }

    if (!found) {
      // Try to find the file amongst the sources
      cmSourceFile* srcFile = this->Makefile->GetSource(
        cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile) {
        if (srcFile->GetFullPath() == path) {
          found = true;
        } else {
          // try to guess which include path to use
          for (std::string incpath : this->IncludeDirectories) {
            if (!incpath.empty() && incpath.back() != '/') {
              incpath = incpath + "/";
            }
            incpath = incpath + path;
            if (srcFile->GetFullPath() == incpath) {
              // set the path to the guessed path
              info->FullPath = incpath;
              found = true;
            }
          }
        }
      }
    }

    if (!found) {
      // Couldn't find any dependency information.
      if (this->ComplainFileRegularExpression.find(info->IncludeName)) {
        cmSystemTools::Error("error cannot find dependencies for " + path);
      } else {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath.clear();
      }
    }
  }